

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_code.hpp
# Opt level: O0

string_ref * __thiscall
system_error2::status_code<void>::message
          (string_ref *__return_storage_ptr__,status_code<void> *this)

{
  status_code<void> *this_local;
  
  if (this->_domain == (status_code_domain *)0x0) {
    status_code_domain::string_ref::string_ref
              (__return_storage_ptr__,"(empty)",0xffffffffffffffff,(void *)0x0,(void *)0x0,
               (void *)0x0,status_code_domain::string_ref::_checking_string_thunk);
  }
  else {
    (**(code **)(*(long *)this->_domain + 0x28))(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

SYSTEM_ERROR2_CONSTEXPR20 string_ref message() const noexcept
  {
    // Avoid MSVC's buggy ternary operator for expensive to destruct things
    if(_domain != nullptr)
    {
      return _domain->_do_message(*this);
    }
    return string_ref("(empty)");
  }